

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O1

string * __thiscall
just::temp::directory::dir_t::next_file_abi_cxx11_(string *__return_storage_ptr__,dir_t *this)

{
  char *pcVar1;
  int iVar2;
  dirent *pdVar3;
  string f;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = (char *)0x0;
  local_40 = 0;
  local_50 = &local_40;
  if (this->_eod == false) {
    pdVar3 = readdir((DIR *)this->_d);
    pcVar1 = local_48;
    if (pdVar3 == (dirent *)0x0) {
      this->_eod = true;
    }
    else {
      strlen(pdVar3->d_name);
      std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar1,(ulong)pdVar3->d_name);
    }
  }
  if (this->_eod == false) {
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 != 0) goto LAB_00107017;
    }
    next_file_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
LAB_00107017:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_50,local_48 + (long)local_50);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string next_file()
        {
          std::string f;
          if (!_eod)
          {
#ifdef _WIN32
            if (_next_eod)
            {
              _eod = true;
            }
            else
            {
              f = _data.cFileName;
              _next_eod = !FindNextFile(_d, &_data);
            }
#else
            if (dirent* d = readdir(_d))
            {
              f = d->d_name;
            }
            else
            {
              _eod = true;
            }
#endif
          }

          return (!_eod && (f == "." || f == "..")) ? next_file() : f;
        }